

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

uint luaH_realasize(Table *t)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = t->alimit;
  if (((char)t->flags < '\0') &&
     (uVar2 = uVar1 - (uVar1 >> 1 & 0x55555555),
     uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333),
     1 < ((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
    uVar1 = uVar1 >> 1 | uVar1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    uVar1 = (uVar1 >> 0x10 | uVar1) + 1;
  }
  return uVar1;
}

Assistant:

LUAI_FUNC unsigned int luaH_realasize (const Table *t) {
  if (limitequalsasize(t))
    return t->alimit;  /* this is the size */
  else {
    unsigned int size = t->alimit;
    /* compute the smallest power of 2 not smaller than 'n' */
    size |= (size >> 1);
    size |= (size >> 2);
    size |= (size >> 4);
    size |= (size >> 8);
#if (UINT_MAX >> 14) > 3  /* unsigned int has more than 16 bits */
    size |= (size >> 16);
#if (UINT_MAX >> 30) > 3
    size |= (size >> 32);  /* unsigned int has more than 32 bits */
#endif
#endif
    size++;
    lua_assert(ispow2(size) && size/2 < t->alimit && t->alimit < size);
    return size;
  }
}